

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O3

PList * p_list_prepend(PList *list,ppointer data)

{
  PList *pPVar1;
  
  pPVar1 = (PList *)p_malloc0(0x10);
  if (pPVar1 == (PList *)0x0) {
    printf("** Error: %s **\n","PList::p_list_prepend: failed to allocate memory");
    pPVar1 = list;
  }
  else {
    pPVar1->data = data;
    if (list != (PList *)0x0) {
      pPVar1->next = list;
    }
  }
  return pPVar1;
}

Assistant:

P_LIB_API PList *
p_list_prepend (PList		*list,
		ppointer	data)
{
	PList *item;

	if (P_UNLIKELY ((item = p_malloc0 (sizeof (PList))) == NULL)) {
		P_ERROR ("PList::p_list_prepend: failed to allocate memory");
		return list;
	}

	item->data = data;

	/* List is empty */
	if (P_UNLIKELY (list == NULL))
		return item;

	item->next = list;

	return item;
}